

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collada.cpp
# Opt level: O0

void CGL::Collada::ColladaParser::parse_sphere(XMLElement *xml,SphereInfo *sphere)

{
  char *pcVar1;
  XMLElement *pXVar2;
  undefined4 *in_RSI;
  double dVar3;
  XMLElement *in_stack_00000028;
  XMLElement *e_radius;
  XMLElement *e_technique;
  string *in_stack_000001e8;
  XMLElement *in_stack_000001f0;
  XMLElement *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  XMLElement *in_stack_ffffffffffffff98;
  allocator local_41;
  string local_40 [32];
  XMLElement *local_20;
  XMLElement *local_18;
  undefined4 *local_10;
  
  local_10 = in_RSI;
  pcVar1 = tinyxml2::XMLElement::Attribute
                     (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                      (char *)in_stack_ffffffffffffff88);
  std::__cxx11::string::operator=((string *)(local_10 + 2),pcVar1);
  pcVar1 = tinyxml2::XMLElement::Attribute
                     (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                      (char *)in_stack_ffffffffffffff88);
  std::__cxx11::string::operator=((string *)(local_10 + 10),pcVar1);
  *local_10 = 2;
  local_18 = get_technique_CGL(in_stack_00000028);
  if (local_18 == (XMLElement *)0x0) {
    exit(1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"sphere/radius",&local_41);
  pXVar2 = get_element(in_stack_000001f0,in_stack_000001e8);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  local_20 = pXVar2;
  if (pXVar2 == (XMLElement *)0x0) {
    exit(1);
  }
  pcVar1 = tinyxml2::XMLElement::GetText(in_stack_ffffffffffffff88);
  dVar3 = atof(pcVar1);
  local_10[0x12] = (float)dVar3;
  return;
}

Assistant:

void ColladaParser::parse_sphere(XMLElement* xml, SphereInfo& sphere) {

  // name & id
  sphere.id   = xml->Attribute( "id" );
  sphere.name = xml->Attribute("name");
  sphere.type = Instance::SPHERE;

  XMLElement* e_technique = get_technique_CGL(xml);
  if (!e_technique) {
    stat("Error: no 462 profile technique in geometry: " << sphere.id);
    exit(EXIT_FAILURE);
  }

  XMLElement* e_radius = get_element(e_technique, "sphere/radius");
  if (!e_radius) {
    stat("Error: invalid sphere definition in geometry: " << sphere.id);
    exit(EXIT_FAILURE);
  }

  sphere.radius = atof(e_radius->GetText());

  // print summary
  stat("  |- " << sphere);
}